

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

natwm_error event_handle(natwm_state *state,xcb_generic_event_t *event)

{
  byte event_type;
  uint8_t type;
  xcb_generic_event_t *event_local;
  natwm_state *state_local;
  
  event_type = event->response_type & 0x7f;
  switch(event_type) {
  case 4:
    state_local._4_4_ = client_handle_button_press(state,(xcb_button_press_event_t *)event);
    break;
  case 5:
    state_local._4_4_ = event_handle_button_release(state,(xcb_button_release_event_t *)event);
    break;
  case 6:
    state_local._4_4_ = event_handle_motion_notify(state,(xcb_motion_notify_event_t *)event);
    break;
  default:
    if (state->monitor_list->extension->type == RANDR) {
      state_local._4_4_ = handle_randr_event(state,event,event_type);
    }
    else {
      state_local._4_4_ = NOT_FOUND_ERROR;
    }
    break;
  case 0x11:
    state_local._4_4_ = event_handle_destroy_notify(state,(xcb_destroy_notify_event_t *)event);
    break;
  case 0x12:
    state_local._4_4_ = event_handle_unmap_notify(state,(xcb_unmap_notify_event_t *)event);
    break;
  case 0x13:
    state_local._4_4_ = event_handle_map_notify(state,(xcb_map_notify_event_t *)event);
    break;
  case 0x14:
    state_local._4_4_ = event_handle_map_request(state,(xcb_map_request_event_t *)event);
    break;
  case 0x17:
    state_local._4_4_ = event_handle_configure_request(state,(xcb_configure_request_event_t *)event)
    ;
    break;
  case 0x1b:
    state_local._4_4_ = event_handle_circulate_request(state,(xcb_circulate_request_event_t *)event)
    ;
    break;
  case 0x21:
    state_local._4_4_ = event_handle_client_message(state,(xcb_client_message_event_t *)event);
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error event_handle(struct natwm_state *state, xcb_generic_event_t *event)
{
        uint8_t type = (uint8_t)(GET_EVENT_TYPE(event->response_type));

        switch (type) {
        case XCB_BUTTON_PRESS:
                return client_handle_button_press(state, (xcb_button_press_event_t *)event);
        case XCB_BUTTON_RELEASE:
                return event_handle_button_release(state, (xcb_button_release_event_t *)event);
        case XCB_CLIENT_MESSAGE:
                return event_handle_client_message(state, (xcb_client_message_event_t *)event);
        case XCB_CONFIGURE_REQUEST:
                return event_handle_configure_request(state,
                                                      (xcb_configure_request_event_t *)event);
        case XCB_CIRCULATE_REQUEST:
                return event_handle_circulate_request(state,
                                                      (xcb_circulate_request_event_t *)event);
        case XCB_DESTROY_NOTIFY:
                return event_handle_destroy_notify(state, (xcb_destroy_notify_event_t *)event);
        case XCB_MAP_REQUEST:
                return event_handle_map_request(state, (xcb_map_request_event_t *)event);
        case XCB_MAP_NOTIFY:
                return event_handle_map_notify(state, (xcb_map_notify_event_t *)event);
        case XCB_MOTION_NOTIFY:
                return event_handle_motion_notify(state, (xcb_motion_notify_event_t *)event);
        case XCB_UNMAP_NOTIFY:
                return event_handle_unmap_notify(state, (xcb_unmap_notify_event_t *)event);
        }

        // If we support randr events we handle those here too
        if (state->monitor_list->extension->type == RANDR) {
                return handle_randr_event(state, event, type);
        }

        return NOT_FOUND_ERROR;
}